

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_md.c
# Opt level: O2

int gost_digest_copy(EVP_MD_CTX *to,EVP_MD_CTX *from)

{
  long lVar1;
  long lVar2;
  void *__dest;
  void *__src;
  
  lVar1 = EVP_MD_CTX_get0_md_data();
  lVar2 = EVP_MD_CTX_get0_md_data(to);
  if (lVar2 != 0) {
    lVar2 = EVP_MD_CTX_get0_md_data(from);
    if (lVar2 != 0) {
      __dest = (void *)EVP_MD_CTX_get0_md_data(to);
      __src = (void *)EVP_MD_CTX_get0_md_data(from);
      memcpy(__dest,__src,0x10d8);
      *(long *)(lVar1 + 8) = lVar1 + 0x78;
    }
  }
  return 1;
}

Assistant:

static int gost_digest_copy(EVP_MD_CTX *to, const EVP_MD_CTX *from)
{
    struct ossl_gost_digest_ctx *md_ctx = EVP_MD_CTX_md_data(to);
    if (EVP_MD_CTX_md_data(to) && EVP_MD_CTX_md_data(from)) {
        memcpy(EVP_MD_CTX_md_data(to), EVP_MD_CTX_md_data(from),
               sizeof(struct ossl_gost_digest_ctx));
        md_ctx->dctx.cipher_ctx = &(md_ctx->cctx);
    }
    return 1;
}